

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::mergefacets(tetgenmesh *this)

{
  undefined8 uVar1;
  int iVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  shellface ppdVar5;
  point pa;
  tetgenmesh *this_00;
  point pc;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  arraypool *this_01;
  ulong *puVar15;
  char *pcVar16;
  void *pvVar17;
  badface *pbVar18;
  long lVar19;
  ulong *puVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  tetgenmesh *this_02;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  shellface *pppdVar28;
  ulong uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double n2 [3];
  double n1 [3];
  uint local_a0;
  double local_68 [4];
  double local_48 [3];
  
  this_01 = (arraypool *)operator_new(0x30);
  this_01->objectbytes = 8;
  this_01->objectsperblock = 0x400;
  this_01->log2objectsperblock = 10;
  this_01->objectsperblockmark = 0x3ff;
  this_01->toparraylen = 0;
  this_01->toparray = (char **)0x0;
  this_01->objects = 0;
  this_01->totalmemory = 0;
  dVar8 = cos((this->b->facet_separate_ang_tol / 180.0) * PI);
  pmVar3 = this->subsegs;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  do {
    puVar15 = (ulong *)memorypool::traverse(pmVar3);
    if (puVar15 == (ulong *)0x0) {
      puVar15 = (ulong *)0x0;
      break;
    }
  } while (puVar15[3] == 0);
  if (puVar15 != (ulong *)0x0) {
LAB_00130ee4:
    lVar19 = (long)this->shmarkindex;
    if (*(int *)((long)puVar15 + lVar19 * 4) == -1) {
      pppdVar28 = (shellface *)(*puVar15 & 0xfffffffffffffff8);
      if (pppdVar28 != (shellface *)0x0) {
        uVar21 = (uint)*puVar15;
        uVar23 = (ulong)((uVar21 & 7) >> 1);
        ppdVar5 = pppdVar28[uVar23];
        uVar29 = (ulong)ppdVar5 & 0xfffffffffffffff8;
        if (uVar29 != 0) {
          uVar27 = (ulong)((uint)((ulong)ppdVar5 >> 1) & 3);
          if (((shellface *)(*(ulong *)(uVar29 + uVar27 * 8) & 0xfffffffffffffff8) == pppdVar28) &&
             (*(int *)((long)pppdVar28 + lVar19 * 4) == *(int *)(uVar29 + lVar19 * 4))) {
            local_a0 = uVar21 & 7;
            pa = (point)puVar15[sorgpivot[0]];
            this_00 = (tetgenmesh *)puVar15[sdestpivot[0]];
            pc = *(point *)(uVar29 + (long)sapexpivot[(uint)ppdVar5 & 7] * 8);
            this_02 = this_00;
            facenormal(this_00,pa,(point)this_00,(point)pppdVar28[sapexpivot[uVar21 & 7]],local_48,1
                       ,(double *)0x0);
            facenormal(this_02,pa,(point)this_00,pc,local_68,1,(double *)0x0);
            dVar14 = local_48[2];
            dVar12 = local_48[1];
            dVar10 = local_48[0];
            dVar13 = local_68[2];
            dVar11 = local_68[1];
            dVar32 = local_68[0];
            dVar33 = local_48[2] * local_48[2] +
                     local_48[0] * local_48[0] + local_48[1] * local_48[1];
            if (dVar33 < 0.0) {
              dVar33 = sqrt(dVar33);
            }
            else {
              dVar33 = SQRT(dVar33);
            }
            dVar34 = dVar13 * dVar13 + dVar32 * dVar32 + dVar11 * dVar11;
            if (dVar34 < 0.0) {
              dVar34 = sqrt(dVar34);
            }
            else {
              dVar34 = SQRT(dVar34);
            }
            dVar33 = (dVar14 * dVar13 + dVar10 * dVar32 + dVar12 * dVar11) / (dVar33 * dVar34);
            if (dVar8 <= dVar33) {
              pcVar16 = arraypool::getblock(this_01,(int)this_01->objects);
              lVar19 = (long)this_01->objectbytes *
                       ((long)this_01->objectsperblock - 1U & this_01->objects);
              this_01->objects = this_01->objects + 1;
              *(double *)(pcVar16 + lVar19) = dVar33;
              puVar15[6] = (ulong)(pcVar16 + lVar19);
            }
            else {
              pppdVar28[uVar23 + 6] = (shellface)0x0;
              *(undefined8 *)(uVar29 + 0x30 + uVar27 * 8) = 0;
              pmVar3 = this->subsegs;
              puVar15[3] = 0;
              *puVar15 = (ulong)pmVar3->deaditemstack;
              pmVar3->deaditemstack = puVar15;
              pmVar3->items = pmVar3->items + -1;
              pbVar18 = (badface *)memorypool::alloc(this->flippool);
              (pbVar18->ss).sh = pppdVar28;
              (pbVar18->ss).shver = local_a0;
              uVar23 = (ulong)((uVar21 & 7) << 2);
              pbVar18->forg = (point)pppdVar28[*(int *)((long)sorgpivot + uVar23)];
              pbVar18->fdest = (point)pppdVar28[*(int *)((long)sdestpivot + uVar23)];
              pbVar18->nextitem = this->flipstack;
              this->flipstack = pbVar18;
            }
          }
        }
      }
      pmVar3 = this->subsegs;
      do {
        puVar15 = (ulong *)memorypool::traverse(pmVar3);
        if (puVar15 == (ulong *)0x0) goto LAB_001311f5;
      } while (puVar15[3] == 0);
    }
    else {
      pmVar3 = this->subsegs;
      do {
        puVar15 = (ulong *)memorypool::traverse(pmVar3);
        if (puVar15 == (ulong *)0x0) goto LAB_001311f5;
      } while (puVar15[3] == 0);
    }
    goto LAB_001311f8;
  }
LAB_00131201:
  dVar8 = cos((this->b->facet_small_ang_tol / 180.0) * PI);
  dVar33 = cos(((this->b->facet_separate_ang_tol + -5.0) / 180.0) * PI);
  pmVar3 = this->subfaces;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  do {
    pvVar17 = memorypool::traverse(pmVar3);
    if (pvVar17 == (void *)0x0) {
      pvVar17 = (void *)0x0;
      break;
    }
  } while (*(long *)((long)pvVar17 + 0x18) == 0);
  if (pvVar17 != (void *)0x0) {
    iVar22 = 0;
    do {
      iVar25 = 0;
      do {
        if ((*(long *)((long)pvVar17 + (long)(iVar22 >> 1) * 8 + 0x30) != 0) &&
           (iVar2 = snextpivot[iVar22],
           *(long *)((long)pvVar17 + (long)(iVar2 >> 1) * 8 + 0x30) != 0)) {
          lVar19 = *(long *)((long)pvVar17 + (long)sorgpivot[iVar22] * 8);
          lVar6 = *(long *)((long)pvVar17 + (long)sdestpivot[iVar22] * 8);
          lVar7 = *(long *)((long)pvVar17 + (long)sapexpivot[iVar22] * 8);
          lVar24 = 0;
          do {
            local_48[lVar24] = *(double *)(lVar19 + lVar24 * 8) - *(double *)(lVar6 + lVar24 * 8);
            dVar13 = local_48[2];
            dVar11 = local_48[1];
            dVar32 = local_48[0];
            lVar24 = lVar24 + 1;
          } while (lVar24 != 3);
          lVar19 = 0;
          do {
            local_68[lVar19] = *(double *)(lVar7 + lVar19 * 8) - *(double *)(lVar6 + lVar19 * 8);
            dVar14 = local_68[2];
            dVar12 = local_68[1];
            dVar10 = local_68[0];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          dVar34 = local_48[2] * local_48[2] + local_48[0] * local_48[0] + local_48[1] * local_48[1]
          ;
          if (dVar34 < 0.0) {
            dVar34 = sqrt(dVar34);
          }
          else {
            dVar34 = SQRT(dVar34);
          }
          dVar9 = dVar14 * dVar14 + dVar10 * dVar10 + dVar12 * dVar12;
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          if (dVar8 < (dVar13 * dVar14 + dVar32 * dVar10 + dVar11 * dVar12) / (dVar34 * dVar9)) {
            puVar15 = (ulong *)(*(ulong *)((long)pvVar17 + (long)(iVar22 >> 1) * 8 + 0x30) &
                               0xfffffffffffffff8);
            uVar30 = 0;
            uVar31 = 0x3ff00000;
            if ((undefined8 *)puVar15[6] != (undefined8 *)0x0) {
              uVar1 = *(undefined8 *)puVar15[6];
              uVar30 = (undefined4)uVar1;
              uVar31 = (undefined4)((ulong)uVar1 >> 0x20);
            }
            puVar20 = (ulong *)(*(ulong *)((long)pvVar17 + (long)(iVar2 >> 1) * 8 + 0x30) &
                               0xfffffffffffffff8);
            dVar32 = 1.0;
            if ((double *)puVar20[6] != (double *)0x0) {
              dVar32 = *(double *)puVar20[6];
            }
            if (dVar33 < (double)CONCAT44(uVar31,uVar30) ||
                dVar33 == (double)CONCAT44(uVar31,uVar30)) {
              puVar15 = puVar20;
              if (dVar33 <= dVar32) {
                puVar15 = (ulong *)0x0;
              }
            }
            else if ((dVar32 < dVar33) &&
                    (dVar32 < (double)CONCAT44(uVar31,uVar30) ||
                     dVar32 == (double)CONCAT44(uVar31,uVar30))) {
              puVar15 = puVar20;
            }
            if (puVar15 != (ulong *)0x0) {
              uVar26 = (uint)*puVar15 & 7;
              pppdVar28 = (shellface *)(*puVar15 & 0xfffffffffffffff8);
              uVar21 = uVar26 * 4;
              uVar23 = *(ulong *)((long)pppdVar28 + (ulong)(uVar21 & 0xfffffff8));
              *(undefined8 *)((long)pppdVar28 + (ulong)(uVar21 & 0xfffffff8) + 0x30) = 0;
              *(undefined8 *)((uVar23 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)uVar23 & 6) * 4)
                   = 0;
              pmVar3 = this->subsegs;
              puVar15[3] = 0;
              *puVar15 = (ulong)pmVar3->deaditemstack;
              pmVar3->deaditemstack = puVar15;
              pmVar3->items = pmVar3->items + -1;
              pbVar18 = (badface *)memorypool::alloc(this->flippool);
              (pbVar18->ss).sh = pppdVar28;
              (pbVar18->ss).shver = uVar26;
              pbVar18->forg = (point)pppdVar28[*(int *)((long)sorgpivot + (ulong)uVar21)];
              pbVar18->fdest = (point)pppdVar28[*(int *)((long)sdestpivot + (ulong)uVar21)];
              pbVar18->nextitem = this->flipstack;
              this->flipstack = pbVar18;
              break;
            }
          }
        }
        iVar22 = snextpivot[iVar22];
        iVar25 = iVar25 + 1;
      } while (iVar25 != 3);
      pmVar3 = this->subfaces;
      do {
        pvVar17 = memorypool::traverse(pmVar3);
        if (pvVar17 == (void *)0x0) {
          pvVar17 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar17 + 0x18) == 0);
    } while (pvVar17 != (void *)0x0);
  }
  arraypool::~arraypool(this_01);
  operator_delete(this_01,0x30);
  if (this->flipstack == (badface *)0x0) {
    return;
  }
  lawsonflip(this);
  return;
LAB_001311f5:
  puVar15 = (ulong *)0x0;
LAB_001311f8:
  if (puVar15 == (ulong *)0x0) goto LAB_00131201;
  goto LAB_00130ee4;
}

Assistant:

void tetgenmesh::mergefacets()
{
  face parentsh, neighsh, neineish;
  face segloop;
  point pa, pb, pc, pd;
  REAL n1[3], n2[3];
  REAL cosang, cosang_tol;


  // Allocate an array to save calcaulated dihedral angles at segments.
  arraypool *dihedangarray = new arraypool(sizeof(double), 10);
  REAL *paryang = NULL;

  // First, remove coplanar segments.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_separate_ang_tol / 180.0 * PI);

  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  while (segloop.sh != (shellface *) NULL) {
    // Only remove a segment if it has a marker '-1'.
    if (shellmark(segloop) != -1) {
      segloop.sh = shellfacetraverse(subsegs);
      continue;
    }
    spivot(segloop, parentsh);
    if (parentsh.sh != NULL) {
      spivot(parentsh, neighsh);
      if (neighsh.sh != NULL) {
        spivot(neighsh, neineish);
        if (neineish.sh == parentsh.sh) {
          // Exactly two subfaces at this segment.
          // Only merge them if they have the same boundary marker.
          if (shellmark(parentsh) == shellmark(neighsh)) {
            pa = sorg(segloop);
            pb = sdest(segloop);
            pc = sapex(parentsh);
            pd = sapex(neighsh);
            // Calculate the dihedral angle at the segment [a,b].
            facenormal(pa, pb, pc, n1, 1, NULL);
            facenormal(pa, pb, pd, n2, 1, NULL);
            cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
            if (cosang < cosang_tol) {
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
            } else {
              // Save 'cosang' to avoid re-calculate it.
              // Re-use the pointer at the first segment.
              dihedangarray->newindex((void **) &paryang);
              *paryang = cosang;
              segloop.sh[6] = (shellface) paryang;
            }
          } 
        } // if (neineish.sh == parentsh.sh)
      }
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  // Second, remove ridge segments at small angles.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_small_ang_tol / 180.0 * PI);
  REAL cosang_sep_tol = cos((b->facet_separate_ang_tol - 5.0) / 180.0 * PI);
  face shloop;
  face seg1, seg2;
  REAL cosang1, cosang2;
  int i, j;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != (shellface *) NULL) {
    for (i = 0; i < 3; i++) {
      if (isshsubseg(shloop)) {
        senext(shloop, neighsh);
        if (isshsubseg(neighsh)) {
          // Found two segments sharing at one vertex.
          // Check if they form a small angle.
          pa = sorg(shloop);
          pb = sdest(shloop);
          pc = sapex(shloop);
          for (j = 0; j < 3; j++) n1[j] = pa[j] - pb[j];
          for (j = 0; j < 3; j++) n2[j] = pc[j] - pb[j];
          cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
          if (cosang > cosang_tol) {
            // Found a small angle.
            segloop.sh = NULL;
            sspivot(shloop, seg1);
            sspivot(neighsh, seg2);
            if (seg1.sh[6] != NULL) {
              paryang = (REAL *) (seg1.sh[6]);
              cosang1 = *paryang;
            } else {
              cosang1 = 1.0; // 0 degree;
            }
            if (seg2.sh[6] != NULL) {
              paryang = (REAL *) (seg2.sh[6]);
              cosang2 = *paryang;
            } else {
              cosang2 = 1.0; // 0 degree;
            }
            if (cosang1 < cosang_sep_tol) {
              if (cosang2 < cosang_sep_tol) {
                if (cosang1 < cosang2) {
                  segloop = seg1;
                } else {
                  segloop = seg2;
                }
              } else {
                segloop = seg1;
              }
            } else {
              if (cosang2 < cosang_sep_tol) {
                segloop = seg2;
              }
            }
            if (segloop.sh != NULL) {
              // Remove this segment.
              segloop.shver = 0;
              spivot(segloop, parentsh);
              spivot(parentsh, neighsh);
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
              break;
            }
          }
        } // if (isshsubseg)
      } // if (isshsubseg)
      senextself(shloop);
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  delete dihedangarray;

  if (flipstack != NULL) {
    lawsonflip(); // Recover Delaunayness.
  }
}